

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedDecimalInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint64 local_28;
  uint64 max_value_local;
  uint64 *value_local;
  ParserImpl *this_local;
  
  local_28 = max_value;
  max_value_local = (uint64)value;
  value_local = (uint64 *)this;
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    local_60 = &pTVar2->text;
    bVar1 = anon_unknown_20::IsHexNumber(local_60);
    if ((!bVar1) && (bVar1 = anon_unknown_20::IsOctNumber(local_60), !bVar1)) {
      bVar1 = io::Tokenizer::ParseInteger(local_60,local_28,(uint64 *)max_value_local);
      if (!bVar1) {
        std::operator+(&local_c0,"Integer out of range (",local_60);
        std::operator+(&local_a0,&local_c0,")");
        ReportError(this,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        return false;
      }
      io::Tokenizer::Next(&this->tokenizer_);
      return true;
    }
    std::operator+(&local_80,"Expect a decimal number, got: ",local_60);
    ReportError(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::operator+(&local_48,"Expected integer, got: ",&pTVar2->text);
    ReportError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return false;
}

Assistant:

bool ConsumeUnsignedDecimalInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    const string& text = tokenizer_.current().text;
    if (IsHexNumber(text) || IsOctNumber(text)) {
      ReportError("Expect a decimal number, got: " + text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(text, max_value, value)) {
      ReportError("Integer out of range (" + text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }